

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pcVar1;
  long lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined8 uVar4;
  long lVar5;
  _Elt_pointer pbVar6;
  bool bVar7;
  int iVar8;
  basic_ostream<char,_std::char_traits<char>_> *pbVar9;
  char *pcVar10;
  ostream *poVar11;
  ulong extraout_RDX;
  _Map_pointer ppbVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  Command *this;
  optional<std::pair<int,_int>_> location;
  int aliasIndex;
  string cmdString;
  string argFile;
  __string_type args;
  string currentFile;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg;
  stringstream joinedArgs;
  ofstream qfOS;
  undefined4 local_7bc;
  string local_7b8;
  long local_798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  string local_770;
  string local_750;
  long *local_730 [2];
  long local_720 [2];
  _Any_data local_710;
  code *local_700;
  code *local_6f8;
  undefined1 *local_6f0;
  undefined8 local_6e8;
  undefined1 local_6e0;
  undefined7 uStack_6df;
  undefined1 local_6d0 [32];
  _Alloc_hider local_6b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6a0;
  _Alloc_hider local_690;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_680;
  bool local_670;
  string local_668;
  string local_648;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_628;
  string local_5d8;
  undefined1 local_5b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8 [14];
  ios_base aiStack_4c0 [264];
  stringstream local_3b8 [16];
  basic_ostream<char,_std::char_traits<char>_> local_3a8 [112];
  ios_base local_338 [264];
  _Quoted_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_230 [15];
  ios_base aiStack_138 [264];
  
  local_628.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_628.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_628.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_628.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_628.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_628.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_628.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_628.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_628.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_628.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::_M_range_initialize<char**>
            ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_628,argv + 1
             ,argv + argc);
  if (local_628.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_628.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
LAB_001053e9:
    helpAndExit();
  }
  local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"/tmp/tag_aliases","");
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (local_628.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur,"--alias-file");
  if (iVar8 == 0) {
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&local_628);
    popFirst((string *)local_5b8,&local_628);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_790,(string *)local_5b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._0_8_ != local_5a8) {
      operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
    }
  }
  popFirst(&local_7b8,&local_628);
  bVar7 = __gnu_cxx::__ops::_Iter_pred<main::$_0>::operator()
                    ((_Iter_pred<main::__0> *)&local_7b8,
                     (Command *)COMMANDS._M_elems[0].cmd_id_._M_dataplus._M_p);
  if (bVar7) {
    local_798 = 0;
  }
  else {
    bVar7 = __gnu_cxx::__ops::_Iter_pred<main::$_0>::operator()
                      ((_Iter_pred<main::__0> *)&local_7b8,
                       (Command *)COMMANDS._M_elems[1].cmd_id_._M_dataplus._M_p);
    local_798 = 0x68;
    if (!bVar7) {
      bVar7 = __gnu_cxx::__ops::_Iter_pred<main::$_0>::operator()
                        ((_Iter_pred<main::__0> *)&local_7b8,
                         (Command *)COMMANDS._M_elems[2].cmd_id_._M_dataplus._M_p);
      local_798 = 0xd0;
      if (!bVar7) {
        bVar7 = __gnu_cxx::__ops::_Iter_pred<main::$_0>::operator()
                          ((_Iter_pred<main::__0> *)&local_7b8,
                           (Command *)COMMANDS._M_elems[3].cmd_id_._M_dataplus._M_p);
        local_798 = 0x138;
        if (!bVar7) {
          bVar7 = __gnu_cxx::__ops::_Iter_pred<main::$_0>::operator()
                            ((_Iter_pred<main::__0> *)&local_7b8,
                             (Command *)COMMANDS._M_elems[4].cmd_id_._M_dataplus._M_p);
          local_798 = 0x1a0;
          if (!bVar7) {
            bVar7 = __gnu_cxx::__ops::_Iter_pred<main::$_0>::operator()
                              ((_Iter_pred<main::__0> *)&local_7b8,
                               (Command *)COMMANDS._M_elems[5].cmd_id_._M_dataplus._M_p);
            local_798 = 0x208;
            if (!bVar7) {
              bVar7 = __gnu_cxx::__ops::_Iter_pred<main::$_0>::operator()
                                ((_Iter_pred<main::__0> *)&local_7b8,
                                 (Command *)COMMANDS._M_elems[6].cmd_id_._M_dataplus._M_p);
              local_798 = 0x270;
              if (!bVar7) goto LAB_001053e9;
            }
          }
        }
      }
    }
  }
  std::__cxx11::stringstream::stringstream(local_3b8);
  pbVar6 = local_628.
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_628.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_628.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    ppbVar12 = local_628.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    pbVar13 = local_628.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last;
    pbVar14 = local_628.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    do {
      pcVar1 = (pbVar14->_M_dataplus)._M_p;
      local_5b8._0_8_ = local_5a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_5b8,pcVar1,pcVar1 + pbVar14->_M_string_length);
      local_230[0]._M_delim = '\"';
      local_230[0]._M_escape = '\\';
      local_230[0]._M_string =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b8;
      pbVar9 = std::__detail::operator<<(local_3a8,local_230);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar9," ",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._0_8_ != local_5a8) {
        operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
      }
      pbVar14 = pbVar14 + 1;
      if (pbVar14 == pbVar13) {
        pbVar14 = ppbVar12[1];
        ppbVar12 = ppbVar12 + 1;
        pbVar13 = pbVar14 + 0x10;
      }
    } while (pbVar14 != pbVar6);
  }
  lVar5 = local_798;
  this = (Command *)((long)&COMMANDS._M_elems[0].cmd_id_._M_dataplus._M_p + local_798);
  std::__cxx11::stringbuf::str();
  iVar8 = fileno(_stdout);
  iVar8 = isatty(iVar8);
  if (iVar8 == 0) {
    pcVar10 = getenv("SKIP_PIPE_FILTERING");
    if (pcVar10 == (char *)0x0) {
      iVar8 = Command::runWithoutDefaultArgs(this,&local_750);
      goto LAB_001052f6;
    }
  }
  local_6d0._0_8_ = local_6d0 + 0x10;
  pcVar1 = (this->cmd_id_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_6d0,pcVar1,
             pcVar1 + *(long *)((long)&COMMANDS._M_elems[0].cmd_id_._M_string_length + lVar5));
  local_6b0._M_p = (pointer)&local_6a0;
  lVar2 = *(long *)((long)&COMMANDS._M_elems[0].cmd_._M_dataplus._M_p + lVar5);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_6b0,lVar2,
             *(long *)((long)&COMMANDS._M_elems[0].cmd_._M_string_length + lVar5) + lVar2);
  local_690._M_p = (pointer)&local_680;
  lVar2 = *(long *)((long)&COMMANDS._M_elems[0].extraArgs_._M_dataplus._M_p + lVar5);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_690,lVar2,
             *(long *)((long)&COMMANDS._M_elems[0].extraArgs_._M_string_length + lVar5) + lVar2);
  local_670 = (&COMMANDS._M_elems[0].includeFiles_)[lVar5];
  local_730[0] = local_720;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_730,local_790._M_dataplus._M_p,
             local_790._M_dataplus._M_p + local_790._M_string_length);
  local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_770,local_750._M_dataplus._M_p,
             local_750._M_dataplus._M_p + local_750._M_string_length);
  local_6f0 = &local_6e0;
  local_6e8 = 0;
  local_6e0 = 0;
  local_7bc = 1;
  std::ofstream::ofstream((ofstream *)local_5b8,(string *)local_730,_S_out);
  std::ofstream::ofstream((ofstream *)local_230,(string *)&QF_FILE_abi_cxx11_,_S_out);
  local_648.field_2._M_allocated_capacity._0_4_ = 0x6c6c61;
  local_648._M_string_length = 3;
  local_668.field_2._M_allocated_capacity._0_4_ = 0x20712d;
  local_668._M_string_length = 3;
  location.super__Optional_base<std::pair<int,_int>,_true,_true>._M_payload.
  super__Optional_payload_base<std::pair<int,_int>_>._8_4_ = 0;
  location.super__Optional_base<std::pair<int,_int>,_true,_true>._M_payload.
  super__Optional_payload_base<std::pair<int,_int>_>._M_payload =
       (_Storage<std::pair<int,_int>,_true>)extraout_RDX;
  local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
  local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
  vimEditCommand(&local_5d8,&QF_FILE_abi_cxx11_,location,&local_668);
  aliasForCommand((string *)&local_710,&local_648,&local_5d8);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_5b8,(char *)local_710._M_unused._0_8_,local_710._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  if ((code **)local_710._M_unused._0_8_ != &local_700) {
    operator_delete(local_710._M_unused._M_object,(ulong)(local_700 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p != &local_668.field_2) {
    operator_delete(local_668._M_dataplus._M_p,
                    CONCAT44(local_668.field_2._M_allocated_capacity._4_4_,
                             local_668.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._M_dataplus._M_p != &local_648.field_2) {
    operator_delete(local_648._M_dataplus._M_p,
                    CONCAT44(local_648.field_2._M_allocated_capacity._4_4_,
                             local_648.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_710._8_8_ = 0;
  local_710._M_unused._M_object = operator_new(0x28);
  *(undefined1 ***)local_710._M_unused._0_8_ = &local_6f0;
  *(ofstream **)((long)local_710._M_unused._0_8_ + 8) = (ofstream *)local_5b8;
  *(undefined4 **)((long)local_710._M_unused._0_8_ + 0x10) = &local_7bc;
  *(_Quoted_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
    **)((long)local_710._M_unused._0_8_ + 0x18) = local_230;
  *(Command **)((long)local_710._M_unused._0_8_ + 0x20) = (Command *)local_6d0;
  local_6f8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/keith[P]tag/tag.cpp:173:24)>
              ::_M_invoke;
  local_700 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/keith[P]tag/tag.cpp:173:24)>
              ::_M_manager;
  iVar8 = Command::run((Command *)local_6d0,&local_770,
                       (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_710);
  if (local_700 != (code *)0x0) {
    (*local_700)(&local_710,&local_710,3);
  }
  uVar4 = __filebuf;
  paVar3 = _VTT;
  local_230[0]._M_string = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_VTT
  ;
  *(undefined8 *)((long)&local_230[0]._M_string + *(long *)(_VTT->_M_local_buf + -0x18)) = __filebuf
  ;
  std::filebuf::~filebuf((filebuf *)&local_230[0]._M_delim);
  std::ios_base::~ios_base(aiStack_138);
  local_5b8._0_8_ = paVar3;
  *(undefined8 *)(local_5b8 + *(long *)(paVar3->_M_local_buf + -0x18)) = uVar4;
  std::filebuf::~filebuf((filebuf *)(local_5b8 + 8));
  std::ios_base::~ios_base(aiStack_4c0);
  if (local_6f0 != &local_6e0) {
    operator_delete(local_6f0,CONCAT71(uStack_6df,local_6e0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770._M_dataplus._M_p != &local_770.field_2) {
    operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
  }
  if (local_730[0] != local_720) {
    operator_delete(local_730[0],local_720[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690._M_p != &local_680) {
    operator_delete(local_690._M_p,local_680._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0._M_p != &local_6a0) {
    operator_delete(local_6b0._M_p,local_6a0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_6d0._0_8_ != local_6d0 + 0x10) {
    operator_delete((void *)local_6d0._0_8_,local_6d0._16_8_ + 1);
  }
LAB_001052f6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != &local_750.field_2) {
    operator_delete(local_750._M_dataplus._M_p,local_750.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_3b8);
  std::ios_base::~ios_base(local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790._M_dataplus._M_p != &local_790.field_2) {
    operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&local_628);
  return iVar8;
}

Assistant:

int main(int argc, char *argv[]) {
  std::deque<std::string> arguments(argv + 1, argv + argc);
  if (arguments.empty())
    helpAndExit();

  std::string argFile("/tmp/tag_aliases");
  if (arguments.front() == "--alias-file") {
    arguments.pop_front();
    argFile = popFirst(arguments);
  }

  let cmdString = popFirst(arguments);
  let *command =
      std::find_if(COMMANDS.begin(), COMMANDS.end(), [&cmdString](auto &cmd) {
        return cmdString == cmd.cmd_id();
      });

  if (command == COMMANDS.end())
    helpAndExit();

  std::stringstream joinedArgs;
  for (auto arg : arguments) {
    joinedArgs << std::quoted(arg) << " ";
  }

  let args = joinedArgs.str();
  let isPiped = !isatty(fileno(stdout));
  if (isPiped && std::getenv("SKIP_PIPE_FILTERING") == nullptr)
    return command->runWithoutDefaultArgs(args);

  return runAndWriteFile(*command, argFile, args);
}